

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int nh_http_parse(http_context_t *ctx)

{
  nh_anchor_t nVar1;
  nh_anchor_t nVar2;
  uint32_t uVar3;
  int iVar4;
  nh_stream_t *stream_00;
  int offset;
  nh_stream_t *stream;
  http_context_t *ctx_local;
  
  stream_00 = &ctx->raw;
  do {
    if ((ctx->raw).length <= (ctx->raw).index) {
      return 1;
    }
    switch(ctx->parse_state) {
    case PARSE_METHOD:
      uVar3 = nh_stream_find_next(stream_00,' ',0x10);
      if ((int)uVar3 < 1) {
        return 0;
      }
      nVar2.len = uVar3;
      nVar2.index = (ctx->raw).index;
      ctx->method = nVar2;
      ctx->parse_state = PARSE_PATH;
      (ctx->raw).index = uVar3 + 1 + (ctx->raw).index;
      break;
    case PARSE_PATH:
      uVar3 = nh_stream_find_next(stream_00,' ',0x800);
      if ((int)uVar3 < 1) {
        return 0;
      }
      nVar1.len = uVar3;
      nVar1.index = (ctx->raw).index;
      ctx->path = nVar1;
      ctx->parse_state = PARSE_VERSION;
      (ctx->raw).index = uVar3 + 1 + (ctx->raw).index;
      break;
    case PARSE_VERSION:
      iVar4 = nh_string_cmp("HTTP/1.",stream_00->buf + (ctx->raw).index,7);
      if (iVar4 == 0) {
        return 0;
      }
      (ctx->raw).index = (ctx->raw).index + 7;
      if (stream_00->buf[(ctx->raw).index] == '0') {
        ctx->version = HTTP_1_0;
      }
      else {
        if (stream_00->buf[(ctx->raw).index] != '1') {
          return 0;
        }
        ctx->version = HTTP_1_1;
      }
      ctx->parse_state = PARSE_LINE_END;
      (ctx->raw).index = (ctx->raw).index + 1;
      break;
    case PARSE_HEADER:
      iVar4 = nh_http_parse_consume_header(ctx);
      if (iVar4 == 0) {
        return 0;
      }
      ctx->parse_state = PARSE_LINE_END;
      break;
    case PARSE_SECOND_LINE_END:
      iVar4 = nh_string_cmp("\r\n",stream_00->buf + (ctx->raw).index,2);
      if (iVar4 == 0) {
        ctx->parse_state = PARSE_HEADER;
        break;
      }
      (ctx->raw).index = (ctx->raw).index + 2;
      ctx->parse_state = PARSE_BODY;
      nh_http_parse_get_body_len(ctx);
    case PARSE_BODY:
      iVar4 = nh_http_parse_consume_body(ctx);
      if (iVar4 != 0) {
        ctx->parse_state = PARSE_DONE;
      }
      break;
    case PARSE_LINE_END:
      iVar4 = nh_string_cmp("\r\n",stream_00->buf + (ctx->raw).index,2);
      if (iVar4 == 0) {
        return 0;
      }
      (ctx->raw).index = (ctx->raw).index + 2;
      ctx->parse_state = PARSE_SECOND_LINE_END;
      break;
    case PARSE_DONE:
      return 1;
    }
  } while( true );
}

Assistant:

int nh_http_parse(http_context_t *ctx) {
    //         Request       = Request-Line
    //                        *(( general-header
    //                         | request-header
    //                         | entity-header ) CRLF)
    //                        CRLF
    //                        [ message-body ]
    //
    // Request-Line   = Method SP Request-URI SP HTTP-Version CRLF
    nh_stream_t *stream = &ctx->raw;
    int offset;
    while (stream->index < stream->length) {
        switch (ctx->parse_state) {
            case PARSE_METHOD:
                if ((offset = nh_stream_find_next(stream, ' ', 16)) <= 0) return 0;
                ctx->method = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_PATH;
                stream->index += offset + 1;
                break;
            case PARSE_PATH:
                if ((offset = nh_stream_find_next(stream, ' ', 2048)) <= 0) return 0;
                ctx->path = (nh_anchor_t) {.index = stream->index, .len = offset};
                ctx->parse_state = PARSE_VERSION;
                stream->index += offset + 1;
                break;
            case PARSE_VERSION:
                if (!nh_string_cmp("HTTP/1.", &stream->buf[stream->index], 7)) return 0;
                stream->index += 7;
                switch (stream->buf[stream->index]) {
                    case '0':
                        ctx->version = HTTP_1_0;
                        break;
                    case '1':
                        ctx->version = HTTP_1_1;
                        break;
                    default:
                        return 0;
                }
                ctx->parse_state = PARSE_LINE_END;
                stream->index += 1;
                break;
            case PARSE_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) return 0;
                stream->index += 2;
                ctx->parse_state = PARSE_SECOND_LINE_END;
                break;
            case PARSE_SECOND_LINE_END:
                if (!nh_string_cmp("\r\n", &stream->buf[stream->index], 2)) {
                    ctx->parse_state = PARSE_HEADER;
                    break;
                }
                // parse body
                stream->index += 2;
                ctx->parse_state = PARSE_BODY;
                // get body length before consume body
                nh_http_parse_get_body_len(ctx);
                // fallthrough
            case PARSE_BODY:
                if (nh_http_parse_consume_body(ctx)) ctx->parse_state = PARSE_DONE;
                break;
            case PARSE_HEADER:
                if (!nh_http_parse_consume_header(ctx)) return 0;
                ctx->parse_state = PARSE_LINE_END;
                break;
            case PARSE_DONE:
                return 1;
        }
    }
    return 1;
}